

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O2

int os_is_file_in_dir(char *filename,char *path,int allow_subdirs,int match_self)

{
  char cVar1;
  int iVar2;
  size_t __n;
  size_t sVar3;
  char *path_00;
  char *path_01;
  uint uVar4;
  char *pcVar5;
  undefined8 uStack_2040;
  char path_buf [4096];
  char filename_buf [4096];
  
  uStack_2040 = 0x103e76;
  iVar2 = os_is_file_absolute(filename);
  pcVar5 = filename;
  if (iVar2 == 0) {
    pcVar5 = filename_buf;
    uStack_2040 = 0x103e92;
    os_get_abs_filename(pcVar5,0x1000,filename);
  }
  uStack_2040 = 0x103e9d;
  iVar2 = os_is_file_absolute(path);
  if (iVar2 == 0) {
    uStack_2040 = 0x103eb4;
    os_get_abs_filename(path_buf,0x1000,path);
    path = path_buf;
  }
  uStack_2040 = 0x103ecf;
  safe_strcpy(filename_buf,0x1000,pcVar5);
  uStack_2040 = 0x103ed7;
  canonicalize_path(filename_buf);
  uStack_2040 = 0x103ee2;
  resolve_path(filename_buf,(size_t)filename_buf,path_00);
  uStack_2040 = 0x103ef5;
  safe_strcpy(path_buf,0x1000,path);
  uStack_2040 = 0x103efd;
  canonicalize_path(path_buf);
  uStack_2040 = 0x103f08;
  resolve_path(path_buf,(size_t)path_buf,path_01);
  uStack_2040 = 0x103f10;
  __n = strlen(filename_buf);
  uStack_2040 = 0x103f1b;
  sVar3 = strlen(path_buf);
  if (sVar3 == 0) {
    sVar3 = 0;
  }
  else {
    sVar3 = sVar3 - (path_buf[sVar3 - 1] == '/');
  }
  if (sVar3 == __n) {
    uStack_2040 = 0x103f4e;
    iVar2 = bcmp(filename_buf,path_buf,__n);
    if (iVar2 == 0) {
      return match_self;
    }
  }
  uVar4 = 0;
  if (sVar3 + 2 <= __n) {
    pcVar5 = filename_buf;
    uStack_2040 = 0x103f73;
    iVar2 = bcmp(pcVar5,path_buf,sVar3);
    uVar4 = 0;
    if ((iVar2 == 0) && (filename_buf[sVar3] == '/')) {
      if (allow_subdirs == 0) {
        for (; (cVar1 = *pcVar5, cVar1 != '\0' && (cVar1 != '/')); pcVar5 = pcVar5 + 1) {
        }
        uVar4 = (uint)(cVar1 == '\0');
      }
      else {
        uVar4 = 1;
      }
    }
  }
  return uVar4;
}

Assistant:

int
os_is_file_in_dir( const char* filename, const char* path,
                   int allow_subdirs, int match_self )
{
    char filename_buf[OSFNMAX], path_buf[OSFNMAX];
    size_t flen, plen;

    // Absolute-ize the filename, if necessary.
    if (not os_is_file_absolute(filename)) {
        os_get_abs_filename(filename_buf, sizeof(filename_buf), filename);
        filename = filename_buf;
    }

    // Absolute-ize the path, if necessary.
    if (not os_is_file_absolute(path)) {
        os_get_abs_filename(path_buf, sizeof(path_buf), path);
        path = path_buf;
    }

    // Canonicalize the paths, to remove .. and . elements - this will make
    // it possible to directly compare the path strings.  Also resolve it
    // to the extent possible, to make sure we're not fooled by symbolic
    // links.
    safe_strcpy(filename_buf, sizeof(filename_buf), filename);
    canonicalize_path(filename_buf);
    resolve_path(filename_buf, sizeof(filename_buf), filename_buf);
    filename = filename_buf;

    safe_strcpy(path_buf, sizeof(path_buf), path);
    canonicalize_path(path_buf);
    resolve_path(path_buf, sizeof(path_buf), path_buf);
    path = path_buf;

    // Get the length of the filename and the length of the path.
    flen = strlen(filename);
    plen = strlen(path);

    // If the path ends in a separator character, ignore that.
    if (plen > 0 and path[plen-1] == '/')
        --plen;

    // if the names match, return true if and only if we're matching the
    // directory to itself
    if (plen == flen && memcmp(filename, path, flen) == 0)
        return match_self;

    // Check that the filename has 'path' as its path prefix.  First, check
    // that the leading substring of the filename matches 'path', ignoring
    // case.  Note that we need the filename to be at least two characters
    // longer than the path: it must have a path separator after the path
    // name, and at least one character for a filename past that.
    if (flen < plen + 2 or memcmp(filename, path, plen) != 0)
        return false;

    // Okay, 'path' is the leading substring of 'filename'; next make sure
    // that this prefix actually ends at a path separator character in the
    // filename.  (This is necessary so that we don't confuse "c:\a\b.txt"
    // as matching "c:\abc\d.txt" - if we only matched the "c:\a" prefix,
    // we'd miss the fact that the file is actually in directory "c:\abc",
    // not "c:\a".)
    if (filename[plen] != '/')
        return false;

    // We're good on the path prefix - we definitely have a file that's
    // within the 'path' directory or one of its subdirectories.  If we're
    // allowed to match on subdirectories, we already have our answer
    // (true).  If we're not allowed to match subdirectories, we still have
    // one more check, which is that the rest of the filename is free of
    // path separator charactres.  If it is, we have a file that's directly
    // in the 'path' directory; otherwise it's in a subdirectory of 'path'
    // and thus isn't a match.
    if (allow_subdirs) {
        // Filename is in the 'path' directory or one of its
        // subdirectories, and we're allowed to match on subdirectories, so
        // we have a match.
        return true;
    }

    // We're not allowed to match subdirectories, so scan the rest of
    // the filename for path separators.  If we find any, the file is
    // in a subdirectory of 'path' rather than directly in 'path'
    // itself, so it's not a match.  If we don't find any separators,
    // we have a file directly in 'path', so it's a match.
    const char* p;
    for (p = filename; *p != '\0' and *p != '/' ; ++p)
        ;

    // If we reached the end of the string without finding a path
    // separator character, it's a match .
    return *p == '\0';
}